

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_analyzeEntropy
                 (void *dstBuffer,size_t maxDstSize,int compressionLevel,void *srcBuffer,
                 size_t *fileSizes,uint nbFiles,void *dictBuffer,size_t dictBufferSize,
                 uint notificationLevel)

{
  byte *pbVar1;
  BYTE *pBVar2;
  seqDef *psVar3;
  offsetCount_t oVar4;
  ZSTD_customMem customMem;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ZSTD_CDict *cdict;
  ZSTD_CCtx *cctx;
  void *__ptr;
  byte *pbVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  U32 offset;
  void *pvVar20;
  ulong uVar21;
  size_t sVar22;
  int iVar23;
  size_t blockSizeMax;
  offsetCount_t bestRepOffset [4];
  uint offcodeCount [31];
  short offcodeNCount [31];
  short litLengthNCount [36];
  uint litLengthCount [36];
  short matchLengthNCount [53];
  uint matchLengthCount [53];
  uint countLit [256];
  HUF_CElt hufTable [257];
  U32 wksp [1216];
  U32 repOffset [1024];
  
  uVar5 = (int)dictBufferSize + 0x20000;
  uVar16 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  sVar6 = ZDICT_totalSampleSize(fileSizes,nbFiles);
  if ((uVar16 ^ 0x1f) == 0) {
    cctx = (ZSTD_CCtx *)0x0;
    __ptr = (void *)0x0;
    cdict = (ZSTD_CDict *)0x0;
    sVar6 = 0xffffffffffffffde;
  }
  else {
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
      countLit[lVar7] = 1;
    }
    uVar17 = (ulong)(0x20 - (uVar16 ^ 0x1f));
    for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
      offcodeCount[uVar8] = 1;
    }
    for (lVar7 = 0; lVar7 != 0x35; lVar7 = lVar7 + 1) {
      matchLengthCount[lVar7] = 1;
    }
    for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 1) {
      litLengthCount[lVar7] = 1;
    }
    memset(repOffset,0,0x1000);
    wksp[8] = 1;
    bestRepOffset[0].offset = 0;
    bestRepOffset[0].count = 0;
    bestRepOffset[1].offset = 0;
    bestRepOffset[1].count = 0;
    bestRepOffset[2].offset = 0;
    bestRepOffset[2].count = 0;
    bestRepOffset[3].offset = 0;
    bestRepOffset[3].count = 0;
    if (compressionLevel == 0) {
      compressionLevel = 3;
    }
    repOffset[1] = wksp[8];
    repOffset[4] = wksp[8];
    repOffset[8] = wksp[8];
    ZSTD_getParams((ZSTD_parameters *)wksp,compressionLevel,sVar6 / (nbFiles + (nbFiles == 0)),
                   dictBufferSize);
    memset((ZSTD_CCtx_params *)wksp,0,0xd0);
    wksp[1] = wksp[0];
    wksp[0x26] = 0;
    wksp[0x27] = 0;
    wksp[0x28] = 0;
    wksp[0x29] = 0;
    wksp[0x2a] = 0;
    wksp[0x2b] = 0;
    customMem.opaque = (void *)0x0;
    customMem.customAlloc = (ZSTD_allocFunction)0x0;
    customMem.customFree = (ZSTD_freeFunction)0x0;
    cdict = ZSTD_createCDict_advanced2
                      (dictBuffer,dictBufferSize,ZSTD_dlm_byRef,ZSTD_dct_rawContent,
                       (ZSTD_CCtx_params *)wksp,customMem);
    cctx = ZSTD_createCCtx();
    __ptr = malloc(0x20000);
    if (__ptr == (void *)0x0 || (cctx == (ZSTD_CCtx *)0x0 || cdict == (ZSTD_CDict *)0x0)) {
      sVar6 = 0xffffffffffffffc0;
      if (notificationLevel != 0) {
        fwrite("Not enough memory \n",0x13,1,_stderr);
        fflush(_stderr);
      }
    }
    else {
      iVar23 = 1 << ((byte)wksp[0] & 0x1f);
      if (0x1ffff < iVar23) {
        iVar23 = 0x20000;
      }
      lVar7 = 0;
      for (uVar8 = 0; uVar8 != nbFiles; uVar8 = uVar8 + 1) {
        uVar18 = fileSizes[uVar8];
        if ((ulong)(long)iVar23 < fileSizes[uVar8]) {
          uVar18 = (long)iVar23;
        }
        sVar6 = ZSTD_compressBegin_usingCDict_deprecated(cctx,cdict);
        if (sVar6 < 0xffffffffffffff89) {
          sVar6 = ZSTD_compressBlock_deprecated
                            (cctx,__ptr,0x20000,(void *)((long)srcBuffer + lVar7),uVar18);
          if (sVar6 < 0xffffffffffffff89) {
            if (sVar6 != 0) {
              pbVar1 = (cctx->seqStore).lit;
              for (pbVar9 = (cctx->seqStore).litStart; pbVar9 < pbVar1; pbVar9 = pbVar9 + 1) {
                countLit[*pbVar9] = countLit[*pbVar9] + 1;
              }
              uVar21 = (long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart;
              ZSTD_seqToCodes(&cctx->seqStore);
              pBVar2 = (cctx->seqStore).ofCode;
              uVar18 = uVar21 >> 3 & 0xffffffff;
              for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                offcodeCount[pBVar2[uVar19]] = offcodeCount[pBVar2[uVar19]] + 1;
              }
              pBVar2 = (cctx->seqStore).mlCode;
              for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                matchLengthCount[pBVar2[uVar19]] = matchLengthCount[pBVar2[uVar19]] + 1;
              }
              pBVar2 = (cctx->seqStore).llCode;
              for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                litLengthCount[pBVar2[uVar19]] = litLengthCount[pBVar2[uVar19]] + 1;
              }
              if ((uVar21 & 0x7fffffff0) != 0) {
                psVar3 = (cctx->seqStore).sequencesStart;
                uVar15 = psVar3->offBase - 3;
                uVar5 = psVar3[1].offBase - 3;
                uVar18 = (ulong)uVar15;
                if (0x3ff < uVar15) {
                  uVar18 = 0;
                }
                if (0x3ff < uVar5) {
                  uVar5 = 0;
                }
                repOffset[uVar18] = repOffset[uVar18] + 3;
                repOffset[uVar5] = repOffset[uVar5] + 1;
              }
            }
          }
          else if (2 < notificationLevel) {
            fprintf(_stderr,"warning : could not compress sample size %u \n",uVar18 & 0xffffffff);
            goto LAB_0017d647;
          }
        }
        else if (notificationLevel != 0) {
          fwrite("warning : ZSTD_compressBegin_usingCDict failed \n",0x30,1,_stderr);
LAB_0017d647:
          fflush(_stderr);
        }
        lVar7 = lVar7 + fileSizes[uVar8];
      }
      if (3 < notificationLevel) {
        fwrite("Offset Code Frequencies : \n",0x1b,1,_stderr);
        fflush(_stderr);
        for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
          fprintf(_stderr,"%2u :%7u \n",uVar8 & 0xffffffff,(ulong)offcodeCount[uVar8]);
          fflush(_stderr);
        }
      }
      sVar6 = HUF_buildCTable_wksp(hufTable,countLit,0xff,0xb,wksp,0x1300);
      if (sVar6 < 0xffffffffffffff89) {
        lVar7 = 1;
        if (sVar6 == 8) {
          if (1 < notificationLevel) {
            fwrite("warning : pathological dataset : literals are not compressible : samples are noisy or too regular \n"
                   ,99,1,_stderr);
            fflush(_stderr);
          }
          lVar7 = 1;
          for (lVar10 = 1; lVar10 != 0x100; lVar10 = lVar10 + 1) {
            countLit[lVar10] = 2;
          }
          countLit[0] = 4;
          countLit[0xfd] = 1;
          countLit[0xfe] = 1;
          sVar6 = HUF_buildCTable_wksp(hufTable,countLit,0xff,0xb,wksp,0x1300);
          if (sVar6 != 9) {
            __assert_fail("maxNbBits==9",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xc210,
                          "size_t ZDICT_analyzeEntropy(void *, size_t, int, const void *, const size_t *, unsigned int, const void *, size_t, unsigned int)"
                         );
          }
          sVar6 = 9;
        }
        for (; lVar7 != 0x400; lVar7 = lVar7 + 1) {
          bestRepOffset[3].count = repOffset[lVar7];
          bestRepOffset[3].offset = (U32)lVar7;
          uVar8 = 3;
          while ((int)uVar8 != 0) {
            uVar5 = (int)uVar8 - 1;
            if (bestRepOffset[uVar8].count <= bestRepOffset[uVar5].count) break;
            oVar4 = bestRepOffset[uVar5];
            bestRepOffset[uVar5] = bestRepOffset[uVar8];
            bestRepOffset[uVar8] = oVar4;
            uVar8 = (ulong)uVar5;
          }
        }
        uVar5 = 0;
        for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
          uVar5 = uVar5 + offcodeCount[uVar8];
        }
        sVar11 = FSE_normalizeCount(offcodeNCount,8,offcodeCount,(ulong)uVar5,uVar16,1);
        if (sVar11 < 0xffffffffffffff89) {
          uVar16 = 0;
          for (lVar7 = 0; lVar7 != 0x35; lVar7 = lVar7 + 1) {
            uVar16 = uVar16 + matchLengthCount[lVar7];
          }
          sVar12 = FSE_normalizeCount(matchLengthNCount,9,matchLengthCount,(ulong)uVar16,0x34,1);
          if (sVar12 < 0xffffffffffffff89) {
            uVar16 = 0;
            for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 1) {
              uVar16 = uVar16 + litLengthCount[lVar7];
            }
            sVar13 = FSE_normalizeCount(litLengthNCount,9,litLengthCount,(ulong)uVar16,0x23,1);
            if (sVar13 < 0xffffffffffffff89) {
              sVar14 = HUF_writeCTable_wksp
                                 (dstBuffer,maxDstSize,hufTable,0xff,(uint)sVar6,wksp,0x1300);
              if (sVar14 < 0xffffffffffffff89) {
                sVar11 = FSE_writeNCount((void *)((long)dstBuffer + sVar14),maxDstSize - sVar14,
                                         offcodeNCount,0x1e,(uint)sVar11);
                if (sVar11 < 0xffffffffffffff89) {
                  pvVar20 = (void *)((long)((long)dstBuffer + sVar14) + sVar11);
                  sVar22 = (maxDstSize - sVar14) - sVar11;
                  sVar6 = FSE_writeNCount(pvVar20,sVar22,matchLengthNCount,0x34,(uint)sVar12);
                  if (sVar6 < 0xffffffffffffff89) {
                    pvVar20 = (void *)((long)pvVar20 + sVar6);
                    sVar22 = sVar22 - sVar6;
                    sVar12 = FSE_writeNCount(pvVar20,sVar22,litLengthNCount,0x23,(uint)sVar13);
                    if (sVar12 < 0xffffffffffffff89) {
                      if (sVar22 - sVar12 < 0xc) {
                        sVar6 = 0xffffffffffffffba;
                        if (notificationLevel != 0) {
                          fwrite("not enough space to write RepOffsets \n",0x26,1,_stderr);
                          fflush(_stderr);
                        }
                      }
                      else {
                        *(undefined8 *)((long)pvVar20 + sVar12) = 0x400000001;
                        *(undefined4 *)((long)pvVar20 + sVar12 + 8) = 8;
                        sVar6 = sVar14 + sVar11 + sVar6 + sVar12 + 0xc;
                      }
                    }
                    else {
                      sVar6 = sVar12;
                      if (notificationLevel != 0) {
                        fwrite("FSE_writeNCount error with litlengthNCount \n",0x2c,1,_stderr);
                        fflush(_stderr);
                      }
                    }
                  }
                  else if (notificationLevel != 0) {
                    fwrite("FSE_writeNCount error with matchLengthNCount \n",0x2e,1,_stderr);
                    fflush(_stderr);
                  }
                }
                else {
                  sVar6 = sVar11;
                  if (notificationLevel != 0) {
                    fwrite("FSE_writeNCount error with offcodeNCount \n",0x2a,1,_stderr);
                    fflush(_stderr);
                  }
                }
              }
              else {
                sVar6 = sVar14;
                if (notificationLevel != 0) {
                  fwrite("HUF_writeCTable error \n",0x17,1,_stderr);
                  fflush(_stderr);
                }
              }
            }
            else {
              sVar6 = sVar13;
              if (notificationLevel != 0) {
                fwrite("FSE_normalizeCount error with litLengthCount \n",0x2e,1,_stderr);
                fflush(_stderr);
              }
            }
          }
          else {
            sVar6 = sVar12;
            if (notificationLevel != 0) {
              fwrite("FSE_normalizeCount error with matchLengthCount \n",0x30,1,_stderr);
              fflush(_stderr);
            }
          }
        }
        else {
          sVar6 = sVar11;
          if (notificationLevel != 0) {
            fwrite("FSE_normalizeCount error with offcodeCount \n",0x2c,1,_stderr);
            fflush(_stderr);
          }
        }
      }
      else if (notificationLevel != 0) {
        fwrite(" HUF_buildCTable error \n",0x18,1,_stderr);
        fflush(_stderr);
      }
    }
  }
  ZSTD_freeCDict(cdict);
  ZSTD_freeCCtx(cctx);
  free(__ptr);
  return sVar6;
}

Assistant:

static size_t ZDICT_analyzeEntropy(void*  dstBuffer, size_t maxDstSize,
                                   int compressionLevel,
                             const void*  srcBuffer, const size_t* fileSizes, unsigned nbFiles,
                             const void* dictBuffer, size_t  dictBufferSize,
                                   unsigned notificationLevel)
{
    unsigned countLit[256];
    HUF_CREATE_STATIC_CTABLE(hufTable, 255);
    unsigned offcodeCount[OFFCODE_MAX+1];
    short offcodeNCount[OFFCODE_MAX+1];
    U32 offcodeMax = ZSTD_highbit32((U32)(dictBufferSize + 128 KB));
    unsigned matchLengthCount[MaxML+1];
    short matchLengthNCount[MaxML+1];
    unsigned litLengthCount[MaxLL+1];
    short litLengthNCount[MaxLL+1];
    U32 repOffset[MAXREPOFFSET];
    offsetCount_t bestRepOffset[ZSTD_REP_NUM+1];
    EStats_ress_t esr = { NULL, NULL, NULL };
    ZSTD_parameters params;
    U32 u, huffLog = 11, Offlog = OffFSELog, mlLog = MLFSELog, llLog = LLFSELog, total;
    size_t pos = 0, errorCode;
    size_t eSize = 0;
    size_t const totalSrcSize = ZDICT_totalSampleSize(fileSizes, nbFiles);
    size_t const averageSampleSize = totalSrcSize / (nbFiles + !nbFiles);
    BYTE* dstPtr = (BYTE*)dstBuffer;
    U32 wksp[HUF_CTABLE_WORKSPACE_SIZE_U32];

    /* init */
    DEBUGLOG(4, "ZDICT_analyzeEntropy");
    if (offcodeMax>OFFCODE_MAX) { eSize = ERROR(dictionaryCreation_failed); goto _cleanup; }   /* too large dictionary */
    for (u=0; u<256; u++) countLit[u] = 1;   /* any character must be described */
    for (u=0; u<=offcodeMax; u++) offcodeCount[u] = 1;
    for (u=0; u<=MaxML; u++) matchLengthCount[u] = 1;
    for (u=0; u<=MaxLL; u++) litLengthCount[u] = 1;
    memset(repOffset, 0, sizeof(repOffset));
    repOffset[1] = repOffset[4] = repOffset[8] = 1;
    memset(bestRepOffset, 0, sizeof(bestRepOffset));
    if (compressionLevel==0) compressionLevel = ZSTD_CLEVEL_DEFAULT;
    params = ZSTD_getParams(compressionLevel, averageSampleSize, dictBufferSize);

    esr.dict = ZSTD_createCDict_advanced(dictBuffer, dictBufferSize, ZSTD_dlm_byRef, ZSTD_dct_rawContent, params.cParams, ZSTD_defaultCMem);
    esr.zc = ZSTD_createCCtx();
    esr.workPlace = malloc(ZSTD_BLOCKSIZE_MAX);
    if (!esr.dict || !esr.zc || !esr.workPlace) {
        eSize = ERROR(memory_allocation);
        DISPLAYLEVEL(1, "Not enough memory \n");
        goto _cleanup;
    }

    /* collect stats on all samples */
    for (u=0; u<nbFiles; u++) {
        ZDICT_countEStats(esr, &params,
                          countLit, offcodeCount, matchLengthCount, litLengthCount, repOffset,
                         (const char*)srcBuffer + pos, fileSizes[u],
                          notificationLevel);
        pos += fileSizes[u];
    }

    if (notificationLevel >= 4) {
        /* writeStats */
        DISPLAYLEVEL(4, "Offset Code Frequencies : \n");
        for (u=0; u<=offcodeMax; u++) {
            DISPLAYLEVEL(4, "%2u :%7u \n", u, offcodeCount[u]);
    }   }

    /* analyze, build stats, starting with literals */
    {   size_t maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(maxNbBits)) {
            eSize = maxNbBits;
            DISPLAYLEVEL(1, " HUF_buildCTable error \n");
            goto _cleanup;
        }
        if (maxNbBits==8) {  /* not compressible : will fail on HUF_writeCTable() */
            DISPLAYLEVEL(2, "warning : pathological dataset : literals are not compressible : samples are noisy or too regular \n");
            ZDICT_flatLit(countLit);  /* replace distribution by a fake "mostly flat but still compressible" distribution, that HUF_writeCTable() can encode */
            maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
            assert(maxNbBits==9);
        }
        huffLog = (U32)maxNbBits;
    }

    /* looking for most common first offsets */
    {   U32 offset;
        for (offset=1; offset<MAXREPOFFSET; offset++)
            ZDICT_insertSortCount(bestRepOffset, offset, repOffset[offset]);
    }
    /* note : the result of this phase should be used to better appreciate the impact on statistics */

    total=0; for (u=0; u<=offcodeMax; u++) total+=offcodeCount[u];
    errorCode = FSE_normalizeCount(offcodeNCount, Offlog, offcodeCount, total, offcodeMax, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with offcodeCount \n");
        goto _cleanup;
    }
    Offlog = (U32)errorCode;

    total=0; for (u=0; u<=MaxML; u++) total+=matchLengthCount[u];
    errorCode = FSE_normalizeCount(matchLengthNCount, mlLog, matchLengthCount, total, MaxML, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with matchLengthCount \n");
        goto _cleanup;
    }
    mlLog = (U32)errorCode;

    total=0; for (u=0; u<=MaxLL; u++) total+=litLengthCount[u];
    errorCode = FSE_normalizeCount(litLengthNCount, llLog, litLengthCount, total, MaxLL, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with litLengthCount \n");
        goto _cleanup;
    }
    llLog = (U32)errorCode;

    /* write result to buffer */
    {   size_t const hhSize = HUF_writeCTable_wksp(dstPtr, maxDstSize, hufTable, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(hhSize)) {
            eSize = hhSize;
            DISPLAYLEVEL(1, "HUF_writeCTable error \n");
            goto _cleanup;
        }
        dstPtr += hhSize;
        maxDstSize -= hhSize;
        eSize += hhSize;
    }

    {   size_t const ohSize = FSE_writeNCount(dstPtr, maxDstSize, offcodeNCount, OFFCODE_MAX, Offlog);
        if (FSE_isError(ohSize)) {
            eSize = ohSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with offcodeNCount \n");
            goto _cleanup;
        }
        dstPtr += ohSize;
        maxDstSize -= ohSize;
        eSize += ohSize;
    }

    {   size_t const mhSize = FSE_writeNCount(dstPtr, maxDstSize, matchLengthNCount, MaxML, mlLog);
        if (FSE_isError(mhSize)) {
            eSize = mhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with matchLengthNCount \n");
            goto _cleanup;
        }
        dstPtr += mhSize;
        maxDstSize -= mhSize;
        eSize += mhSize;
    }

    {   size_t const lhSize = FSE_writeNCount(dstPtr, maxDstSize, litLengthNCount, MaxLL, llLog);
        if (FSE_isError(lhSize)) {
            eSize = lhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with litlengthNCount \n");
            goto _cleanup;
        }
        dstPtr += lhSize;
        maxDstSize -= lhSize;
        eSize += lhSize;
    }

    if (maxDstSize<12) {
        eSize = ERROR(dstSize_tooSmall);
        DISPLAYLEVEL(1, "not enough space to write RepOffsets \n");
        goto _cleanup;
    }
# if 0
    MEM_writeLE32(dstPtr+0, bestRepOffset[0].offset);
    MEM_writeLE32(dstPtr+4, bestRepOffset[1].offset);
    MEM_writeLE32(dstPtr+8, bestRepOffset[2].offset);
#else
    /* at this stage, we don't use the result of "most common first offset",
     * as the impact of statistics is not properly evaluated */
    MEM_writeLE32(dstPtr+0, repStartValue[0]);
    MEM_writeLE32(dstPtr+4, repStartValue[1]);
    MEM_writeLE32(dstPtr+8, repStartValue[2]);
#endif
    eSize += 12;

_cleanup:
    ZSTD_freeCDict(esr.dict);
    ZSTD_freeCCtx(esr.zc);
    free(esr.workPlace);

    return eSize;
}